

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyb_gga_xc_cam_o3lyp.c
# Opt level: O0

void set_ext_params(xc_func_type *p,double *ext_params)

{
  double *in_RSI;
  xc_func_type *in_RDI;
  double dVar1;
  double cx;
  
  dVar1 = get_ext_param(in_RDI,in_RSI,0);
  *in_RDI->mix_coef = 1.0 - dVar1;
  in_RDI->cam_alpha = dVar1;
  return;
}

Assistant:

static void
set_ext_params(xc_func_type *p, const double *ext_params)
{
  /* This is the fraction of LDA exchange in OPTX */
  const double a1 = 1.05151;
  double csr, b, c, clyp, clr, omega;

  assert(p != NULL);
  csr   = get_ext_param(p, ext_params, 0);
  b     = get_ext_param(p, ext_params, 1);
  c     = get_ext_param(p, ext_params, 2);
  clyp  = get_ext_param(p, ext_params, 3);
  clr   = get_ext_param(p, ext_params, 4);
  omega = get_ext_param(p, ext_params, 5);

  /* Remove double counting of LDA exchange */
  p->mix_coef[0] = b - a1*c;
  p->mix_coef[1] = c;
  p->mix_coef[2] = 1.0 - clyp;
  p->mix_coef[3] = clyp;

  /* Set range separation */
  xc_func_set_ext_params_name(p->func_aux[0], "_omega", omega);
  xc_func_set_ext_params_name(p->func_aux[1], "_omega", omega);

  /* Set hybrid terms */
  p->cam_beta = csr-clr;
  p->cam_omega = omega;
  p->cam_alpha = clr;
}